

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O3

string * tinyusdz::unescapeBackslash(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  ulong uVar2;
  string bs_unescaped;
  string bs;
  long *local_60;
  long local_58;
  long local_50 [2];
  long *local_40;
  char *local_38;
  long local_30 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + str->_M_string_length);
  local_40 = local_30;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"\\\\","");
  local_60 = local_50;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"\\","");
  for (uVar2 = ::std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)local_40,0);
      uVar2 != 0xffffffffffffffff;
      uVar2 = ::std::__cxx11::string::find
                        ((char *)__return_storage_ptr__,(ulong)local_40,uVar2 + local_58)) {
    ::std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar2,local_38,(ulong)local_60);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string unescapeBackslash(const std::string &str) {
  std::string s = str;

  std::string bs = "\\\\";
  std::string bs_unescaped = "\\";

  std::string::size_type pos = 0;
  while ((pos = s.find(bs, pos)) != std::string::npos) {
    s.replace(pos, bs.length(), bs_unescaped);
    pos += bs_unescaped.length();
  }

  return s;
}